

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O1

void * C_std::IPC::Mmap(void *addr,size_t length,int prot,int flags,int fd,off_t offset)

{
  void *pvVar1;
  string local_38;
  
  pvVar1 = mmap(addr,length,prot,flags,fd,offset);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"mmap error","");
    perror_exit(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return pvVar1;
}

Assistant:

void *Mmap(void *addr, size_t length, int prot, int flags, int fd, off_t offset) {
            void *p = mmap(addr, length, prot, flags, fd, offset);
            if (p == MAP_FAILED) {
                perror_exit("mmap error");
            }
            return p;
        }